

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

Section __thiscall
QtPrivate::QCalendarYearValidator::handleKey(QCalendarYearValidator *this,int key)

{
  ulong uVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int in_ESI;
  QCalendarYearValidator *in_RDI;
  double in_XMM0_Qa;
  int pow;
  int pressedKey;
  int pow_1;
  Section local_4;
  
  if ((in_ESI == 0x1000014) || (in_ESI == 0x1000012)) {
    in_RDI->m_pos = 0;
    local_4 = ThisSection;
  }
  else if (in_ESI == 0x1000013) {
    in_RDI->m_pos = 0;
    in_RDI->m_year = in_RDI->m_year + 1;
    local_4 = ThisSection;
  }
  else if (in_ESI == 0x1000015) {
    in_RDI->m_pos = 0;
    in_RDI->m_year = in_RDI->m_year + -1;
    local_4 = ThisSection;
  }
  else if ((in_ESI == 0x1000061) || (in_ESI == 0x1000003)) {
    in_RDI->m_pos = in_RDI->m_pos + -1;
    if (in_RDI->m_pos < 0) {
      in_RDI->m_pos = 3;
    }
    pow10(in_RDI,in_XMM0_Qa);
    uVar1 = (long)in_RDI->m_year % (long)(extraout_EAX * 10);
    in_RDI->m_year =
         (in_RDI->m_oldYear / extraout_EAX) * extraout_EAX +
         (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 10);
    if (in_RDI->m_pos == 0) {
      local_4 = PrevSection;
    }
    else {
      local_4 = ThisSection;
    }
  }
  else if ((in_ESI < 0x30) || (0x39 < in_ESI)) {
    local_4 = ThisSection;
  }
  else {
    pow10(in_RDI,in_XMM0_Qa);
    in_RDI->m_year =
         (in_RDI->m_year / (extraout_EAX_00 * 10)) * extraout_EAX_00 * 10 +
         (in_RDI->m_year % extraout_EAX_00) * 10 + in_ESI + -0x30;
    in_RDI->m_pos = in_RDI->m_pos + 1;
    if (in_RDI->m_pos < 4) {
      local_4 = ThisSection;
    }
    else {
      in_RDI->m_pos = 0;
      local_4 = NextSection;
    }
  }
  return local_4;
}

Assistant:

QCalendarDateSectionValidator::Section QCalendarYearValidator::handleKey(int key)
{
    if (key == Qt::Key_Right || key == Qt::Key_Left) {
        m_pos = 0;
        return QCalendarDateSectionValidator::ThisSection;
    } else if (key == Qt::Key_Up) {
        m_pos = 0;
        ++m_year;
        return QCalendarDateSectionValidator::ThisSection;
    } else if (key == Qt::Key_Down) {
        m_pos = 0;
        --m_year;
        return QCalendarDateSectionValidator::ThisSection;
    } else if (key == Qt::Key_Back || key == Qt::Key_Backspace) {
        --m_pos;
        if (m_pos < 0)
            m_pos = 3;

        int pow = pow10(m_pos);
        m_year = m_oldYear / pow * pow + m_year % (pow * 10) / 10;

        if (m_pos == 0)
            return QCalendarDateSectionValidator::PrevSection;
        return QCalendarDateSectionValidator::ThisSection;
    }
    if (key < Qt::Key_0 || key > Qt::Key_9)
        return QCalendarDateSectionValidator::ThisSection;
    int pressedKey = key - Qt::Key_0;
    int pow = pow10(m_pos);
    m_year = m_year / (pow * 10) * (pow * 10) + m_year % pow * 10 + pressedKey;
    ++m_pos;
    if (m_pos > 3) {
        m_pos = 0;
        return QCalendarDateSectionValidator::NextSection;
    }
    return QCalendarDateSectionValidator::ThisSection;
}